

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

ActionMessage * __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::pop(BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  bool bVar2;
  long in_RSI;
  ActionMessage *in_RDI;
  unique_lock<std::mutex> pullLock;
  optional<helics::ActionMessage> val;
  ActionMessage *actval;
  reference in_stack_fffffffffffffe18;
  reference in_stack_fffffffffffffe20;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffe58;
  
  bVar1 = false;
  helics::ActionMessage::ActionMessage(in_RDI);
  try_pop(in_stack_fffffffffffffe58);
  do {
    bVar2 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x50fcb1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x50ff27);
      helics::ActionMessage::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      bVar1 = true;
      break;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffe20,
               (mutex_type *)in_stack_fffffffffffffe18);
    bVar2 = CLI::std::
            queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
            ::empty((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                     *)0x50fce5);
    if (bVar2) {
      bVar2 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                        ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                         in_RDI);
      if (bVar2) {
        std::condition_variable::wait((unique_lock *)(in_RSI + 0xd8));
        bVar2 = CLI::std::
                queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                ::empty((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                         *)0x50fe12);
        if (bVar2) {
          bVar2 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                              *)in_RDI);
          if (bVar2) {
            std::unique_lock<std::mutex>::unlock
                      ((unique_lock<std::mutex> *)in_stack_fffffffffffffe20);
            try_pop(in_stack_fffffffffffffe58);
            std::optional<helics::ActionMessage>::operator=
                      ((optional<helics::ActionMessage> *)in_stack_fffffffffffffe20,
                       (optional<helics::ActionMessage> *)in_stack_fffffffffffffe18);
            std::optional<helics::ActionMessage>::~optional
                      ((optional<helics::ActionMessage> *)0x50fef0);
            bVar2 = false;
          }
          else {
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                      ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                       in_stack_fffffffffffffe20);
            helics::ActionMessage::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                      ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                       0x50fe9f);
            bVar1 = true;
            bVar2 = true;
          }
        }
        else {
          in_stack_fffffffffffffe18 =
               CLI::std::
               queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
               ::front((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                        *)0x50fe27);
          helics::ActionMessage::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          CLI::std::
          queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
          ::pop((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                 *)0x50fe4c);
          bVar1 = true;
          bVar2 = true;
        }
      }
      else {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_fffffffffffffe20);
        helics::ActionMessage::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x50fdd0
                  );
        bVar1 = true;
        bVar2 = true;
      }
    }
    else {
      in_stack_fffffffffffffe20 =
           CLI::std::
           queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
           ::front((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                    *)0x50fcfe);
      helics::ActionMessage::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      CLI::std::
      queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
      ::pop((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
             *)0x50fd25);
      bVar1 = true;
      bVar2 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffe20)
    ;
  } while (!bVar2);
  std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x50ff54);
  if (!bVar1) {
    helics::ActionMessage::~ActionMessage(in_stack_fffffffffffffe20);
  }
  return in_RDI;
}

Assistant:

T pop()
        {
            T actval;
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            actval = std::move(*val);
            return actval;
        }